

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  int iVar1;
  long lVar2;
  char local_1058 [8];
  char zPwd [4098];
  undefined1 local_48 [8];
  DbPath path;
  char *zOut_local;
  int nOut_local;
  char *zPath_local;
  sqlite3_vfs *pVfs_local;
  
  local_48._0_4_ = 0;
  path.zOut._4_4_ = 0;
  local_48._4_4_ = 0;
  path._0_8_ = zOut;
  path.zOut._0_4_ = nOut;
  path._16_8_ = zOut;
  if (*zPath != '/') {
    lVar2 = (*aSyscall[3].pCurrent)(local_1058,0x1000);
    if (lVar2 == 0) {
      iVar1 = sqlite3CantopenError(0xb021);
      iVar1 = unixLogErrorAtLine(iVar1,"getcwd",zPath,0xb021);
      return iVar1;
    }
    appendAllPathElements((DbPath *)local_48,local_1058);
  }
  appendAllPathElements((DbPath *)local_48,zPath);
  *(undefined1 *)(path._16_8_ + (long)path.zOut._4_4_) = 0;
  if ((local_48._0_4_ == 0) && (1 < path.zOut._4_4_)) {
    if (local_48._4_4_ == 0) {
      pVfs_local._4_4_ = 0;
    }
    else {
      pVfs_local._4_4_ = 0x200;
    }
  }
  else {
    pVfs_local._4_4_ = sqlite3CantopenError(0xb027);
  }
  return pVfs_local._4_4_;
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
  DbPath path;
  UNUSED_PARAMETER(pVfs);
  path.rc = 0;
  path.nUsed = 0;
  path.nSymlink = 0;
  path.nOut = nOut;
  path.zOut = zOut;
  if( zPath[0]!='/' ){
    char zPwd[SQLITE_MAX_PATHLEN+2];
    if( osGetcwd(zPwd, sizeof(zPwd)-2)==0 ){
      return unixLogError(SQLITE_CANTOPEN_BKPT, "getcwd", zPath);
    }
    appendAllPathElements(&path, zPwd);
  }
  appendAllPathElements(&path, zPath);
  zOut[path.nUsed] = 0;
  if( path.rc || path.nUsed<2 ) return SQLITE_CANTOPEN_BKPT;
  if( path.nSymlink ) return SQLITE_OK_SYMLINK;
  return SQLITE_OK;
}